

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::rowsAboutToBeRemoved
          (QAbstractItemView *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  QModelIndex child;
  const_iterator it;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemViewPrivate *pQVar5;
  ulong uVar6;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QWidget *editor;
  bool found;
  int rowCount;
  int row;
  int totalToRemove;
  QAbstractItemViewPrivate *d;
  QModelIndex directChild;
  QModelIndex index_1;
  iterator i;
  anon_class_1_0_00000001 findDirectChildOf;
  QModelIndex next;
  QModelIndex index;
  QModelIndex current;
  QEditorInfo info;
  QModelIndex *in_stack_fffffffffffffdd8;
  QAbstractItemViewPrivate *in_stack_fffffffffffffde0;
  QModelIndex *in_stack_fffffffffffffde8;
  QModelIndex *in_stack_fffffffffffffdf0;
  QHash<QWidget_*,_QPersistentModelIndex> *in_stack_fffffffffffffdf8;
  QEditorIndexHash *this_00;
  QModelIndex *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  undefined2 in_stack_fffffffffffffe24;
  byte in_stack_fffffffffffffe26;
  byte in_stack_fffffffffffffe27;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 uVar7;
  uint in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  const_iterator local_190;
  piter local_180;
  QPersistentModelIndex local_170;
  QPersistentModelIndexData *local_168;
  QAbstractItemViewPrivate *local_160;
  QModelIndex *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_140;
  QPersistentModelIndex local_138;
  QAbstractItemViewPrivate *local_130;
  QModelIndex *local_128;
  piter local_120;
  piter local_110;
  undefined1 local_f9;
  undefined1 local_f8 [24];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [24];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QAbstractItemView *)0x80da4c);
  setState((QAbstractItemView *)in_stack_fffffffffffffde0,
           (State)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex((QAbstractItemView *)in_stack_fffffffffffffdf0);
  uVar7 = false;
  if (pQVar5->selectionMode == SingleSelection) {
    bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffde0);
    uVar7 = false;
    if (bVar2) {
      iVar4 = QModelIndex::row((QModelIndex *)&local_38);
      uVar7 = false;
      if (in_EDX <= iVar4) {
        iVar4 = QModelIndex::row((QModelIndex *)&local_38);
        uVar7 = false;
        if (iVar4 <= in_ECX) {
          QModelIndex::parent(in_stack_fffffffffffffdf0);
          uVar7 = ::operator==((QModelIndex *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        }
      }
    }
  }
  if ((bool)uVar7 != false) {
    in_stack_fffffffffffffe4c = (in_ECX - in_EDX) + 1;
    iVar4 = (**(code **)(*(long *)pQVar5->model + 0x78))(pQVar5->model,in_RSI);
    if (in_stack_fffffffffffffe4c < iVar4) {
      iVar4 = in_ECX + 1;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::QModelIndex((QModelIndex *)0x80dced);
      in_stack_fffffffffffffe44 = (**(code **)(*(long *)pQVar5->model + 0x78))(pQVar5->model,in_RSI)
      ;
      in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 & 0xffffff;
      do {
        in_stack_fffffffffffffe48 = iVar4;
        in_stack_fffffffffffffe26 = 0;
        if (in_stack_fffffffffffffe48 < in_stack_fffffffffffffe44) {
          in_stack_fffffffffffffe26 = (byte)(in_stack_fffffffffffffe40 >> 0x18) ^ 0xff;
        }
        if ((in_stack_fffffffffffffe26 & 1) == 0) goto LAB_0080de0e;
        in_stack_fffffffffffffe10 = (QModelIndex *)pQVar5->model;
        iVar4 = in_stack_fffffffffffffe48 + 1;
        in_stack_fffffffffffffe20 = QModelIndex::column((QModelIndex *)&local_38);
        QModelIndex::parent(in_stack_fffffffffffffdf0);
        (**(code **)(*(long *)in_stack_fffffffffffffe10 + 0x60))
                  (&local_b0,in_stack_fffffffffffffe10,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe20,local_c8);
        local_98 = local_b0;
        local_90 = local_a8;
        local_88 = local_a0;
        uVar6 = (**(code **)(*in_RDI + 0x2c0))(in_RDI,&local_98);
        in_stack_fffffffffffffe1c = in_stack_fffffffffffffe48;
      } while (((uVar6 & 1) != 0) ||
              (bVar2 = QAbstractItemViewPrivate::isIndexEnabled
                                 (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8),
              in_stack_fffffffffffffe1c = in_stack_fffffffffffffe48, !bVar2));
      in_stack_fffffffffffffe40 = CONCAT13(1,(int3)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe48 = iVar4;
LAB_0080de0e:
      if ((in_stack_fffffffffffffe40 & 0x1000000) == 0) {
        iVar4 = in_EDX + -1;
        do {
          in_stack_fffffffffffffe48 = iVar4;
          if (iVar4 < 0) break;
          pQVar1 = pQVar5->model;
          in_stack_fffffffffffffe48 = iVar4 + -1;
          iVar3 = QModelIndex::column((QModelIndex *)&local_38);
          QModelIndex::parent(in_stack_fffffffffffffdf0);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_e0,pQVar1,iVar4,iVar3,local_f8);
          local_98 = local_e0;
          local_90 = local_d8;
          local_88 = local_d0;
          uVar6 = (**(code **)(*in_RDI + 0x2c0))(in_RDI,&local_98);
          iVar4 = in_stack_fffffffffffffe48;
        } while (((uVar6 & 1) != 0) ||
                (bVar2 = QAbstractItemViewPrivate::isIndexEnabled
                                   (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8),
                iVar4 = in_stack_fffffffffffffe48, !bVar2));
      }
      setCurrentIndex((QAbstractItemView *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    }
    else {
      local_68 = *in_RSI;
      local_60 = in_RSI[1];
      local_58 = in_RSI[2];
      while( true ) {
        bVar2 = ::operator!=((QModelIndex *)in_stack_fffffffffffffde0,
                             (QPersistentModelIndex *)in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffe27 = 0;
        if (bVar2) {
          bVar2 = QAbstractItemViewPrivate::isIndexEnabled
                            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffe27 = bVar2 ^ 0xff;
        }
        if ((in_stack_fffffffffffffe27 & 1) == 0) break;
        QModelIndex::parent(in_stack_fffffffffffffdf0);
        local_68 = local_80;
        local_60 = local_78;
        local_58 = local_70;
      }
      bVar2 = ::operator!=((QModelIndex *)in_stack_fffffffffffffde0,
                           (QPersistentModelIndex *)in_stack_fffffffffffffdd8);
      if (bVar2) {
        setCurrentIndex((QAbstractItemView *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      }
    }
  }
  local_f9 = 0xaa;
  local_110.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_110.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_110 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::begin(in_stack_fffffffffffffdf8);
  while( true ) {
    local_120 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::end
                                 ((QHash<QWidget_*,_QPersistentModelIndex> *)
                                  in_stack_fffffffffffffde8);
    bVar2 = QHash<QWidget_*,_QPersistentModelIndex>::iterator::operator!=
                      ((iterator *)in_stack_fffffffffffffde8,(iterator *)in_stack_fffffffffffffde0);
    if (!bVar2) break;
    local_138.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_130 = (QAbstractItemViewPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_128 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<QWidget_*,_QPersistentModelIndex>::iterator::value((iterator *)0x80dfdf);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_138);
    local_150 = &DAT_aaaaaaaaaaaaaaaa;
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    local_140.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_168 = local_138.d;
    local_160 = local_130;
    local_158 = local_128;
    child.c._0_2_ = in_stack_fffffffffffffe24;
    child.r = in_stack_fffffffffffffe20;
    child.c._2_1_ = in_stack_fffffffffffffe26;
    child.c._3_1_ = in_stack_fffffffffffffe27;
    child.i = (quintptr)in_RDI;
    child.m.ptr._0_7_ = in_stack_fffffffffffffe30;
    child.m.ptr._7_1_ = uVar7;
    in_stack_fffffffffffffde0 = local_130;
    in_stack_fffffffffffffde8 = local_128;
    rowsAboutToBeRemoved::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffdf0,local_128,child);
    bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffde0);
    if (((bVar2) && (iVar4 = QModelIndex::row((QModelIndex *)&local_150), in_EDX <= iVar4)) &&
       (iVar4 = QModelIndex::row((QModelIndex *)&local_150), iVar4 <= in_ECX)) {
      QHash<QWidget_*,_QPersistentModelIndex>::iterator::key((iterator *)0x80e0e1);
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffdf0 = (QModelIndex *)&pQVar5->indexEditorHash;
      QPersistentModelIndex::QPersistentModelIndex(&local_170,(QModelIndex *)&local_138);
      QHash<QPersistentModelIndex,_QEditorInfo>::take
                ((QHash<QPersistentModelIndex,_QEditorInfo> *)in_stack_fffffffffffffde8,
                 (QPersistentModelIndex *)in_stack_fffffffffffffde0);
      QPersistentModelIndex::~QPersistentModelIndex(&local_170);
      this_00 = &pQVar5->editorIndexHash;
      QHash<QWidget_*,_QPersistentModelIndex>::const_iterator::const_iterator
                (&local_190,(iterator *)&local_110);
      it.i.d._4_4_ = in_stack_fffffffffffffe44;
      it.i.d._0_4_ = in_stack_fffffffffffffe40;
      it.i.bucket._0_4_ = in_stack_fffffffffffffe48;
      it.i.bucket._4_4_ = in_stack_fffffffffffffe4c;
      local_180 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase(this_00,it);
      local_110 = local_180;
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x80e1de);
      if (bVar2) {
        QAbstractItemViewPrivate::releaseEditor
                  ((QAbstractItemViewPrivate *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,
                                     CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)))
                   ,(QWidget *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10);
      }
      QEditorInfo::~QEditorInfo((QEditorInfo *)0x80e208);
    }
    else {
      QHash<QWidget_*,_QPersistentModelIndex>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffdf0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_D(QAbstractItemView);

    setState(CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = currentIndex();
    if (d->selectionMode == SingleSelection
        && current.isValid()
        && current.row() >= start
        && current.row() <= end
        && current.parent() == parent) {
        int totalToRemove = end - start + 1;
        if (d->model->rowCount(parent) <= totalToRemove) { // no more children
            QModelIndex index = parent;
            while (index != d->root && !d->isIndexEnabled(index))
                index = index.parent();
            if (index != d->root)
                setCurrentIndex(index);
        } else {
            int row = end + 1;
            QModelIndex next;
            const int rowCount = d->model->rowCount(parent);
            bool found = false;
            // find the next visible and enabled item
            while (row < rowCount && !found) {
                next = d->model->index(row++, current.column(), current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!isIndexHidden(next) && d->isIndexEnabled(next)) {
                    found = true;
                    break;
                }
            }

            if (!found) {
                row = start - 1;
                // find the previous visible and enabled item
                while (row >= 0) {
                    next = d->model->index(row--, current.column(), current.parent());
#ifdef QT_DEBUG
                    if (!next.isValid()) {
                        qWarning("Model unexpectedly returned an invalid index");
                        break;
                    }
#endif
                    if (!isIndexHidden(next) && d->isIndexEnabled(next))
                        break;
                }
            }

            setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    const auto findDirectChildOf = [](const QModelIndex &parent, QModelIndex child)
    {
        while (child.isValid()) {
            const auto parentIndex = child.parent();
            if (parentIndex == parent)
                return child;
            child = parentIndex;
        }
        return QModelIndex();
    };
    QEditorIndexHash::iterator i = d->editorIndexHash.begin();
    while (i != d->editorIndexHash.end()) {
        const QModelIndex index = i.value();
        const QModelIndex directChild = findDirectChildOf(parent, index);
        if (directChild.isValid() && directChild.row() >= start && directChild.row() <= end) {
            QWidget *editor = i.key();
            QEditorInfo info = d->indexEditorHash.take(index);
            i = d->editorIndexHash.erase(i);
            if (info.widget)
                d->releaseEditor(editor, index);
        } else {
            ++i;
        }
    }
}